

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this)

{
  ExtPrivkey *this_local;
  
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Privkey::Privkey(&this->privkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey() {
  // do nothing
}